

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorRepresentable
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  uint uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  TextureChannelClass TVar8;
  tcu *ptVar9;
  ConstPixelBufferAccess *pCVar10;
  int i;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  tcu *ptVar15;
  ConstPixelBufferAccess *pCVar16;
  tcu *this;
  ConstPixelBufferAccess *pCVar17;
  ulong uVar18;
  float fVar19;
  ulong uVar20;
  float fVar21;
  GenericVec4 GVar22;
  Vec4 sRGB;
  BVec4 channelMask;
  Vector<float,_4> res;
  Vec4 linearized;
  ArrayBuffer<unsigned_char,_4UL,_1UL> buffer;
  PixelBufferAccess access;
  Vec4 local_c8;
  tcu local_ac [4];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ArrayBuffer<unsigned_char,_4UL,_1UL> local_88;
  PixelBufferAccess local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  
  GVar22 = mapToFormatColorUnits(texFormat,normalizedRange);
  tcu::getTextureFormatChannelMask(local_ac,texFormat);
  iVar6 = tcu::TextureFormat::getPixelSize(texFormat);
  de::ArrayBuffer<unsigned_char,_4UL,_1UL>::ArrayBuffer(&local_88,(long)iVar6);
  local_c8.m_data._0_8_ = &DAT_100000001;
  local_c8.m_data[2] = 1.4013e-45;
  tcu::PixelBufferAccess::PixelBufferAccess(&local_70,texFormat,(IVec3 *)&local_c8,local_88.m_ptr);
  bVar5 = tcu::isSRGB(*texFormat);
  if (bVar5) {
    tcu::linearToSRGB((tcu *)&local_c8,normalizedRange);
    uVar11 = 0x7e - ((int)local_c8.m_data[0] >> 0x17);
    uVar1 = (((uint)local_c8.m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar11 & 0x1f)) +
            0x800000;
    if (8 < uVar11) {
      uVar1 = uVar11;
    }
    uVar12 = 0x7e - ((int)local_c8.m_data[1] >> 0x17);
    uVar11 = (((uint)local_c8.m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
             0x800000;
    if (8 < uVar12) {
      uVar11 = uVar12;
    }
    uVar13 = 0x7e - ((int)local_c8.m_data[2] >> 0x17);
    uVar12 = (((uint)local_c8.m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
             0x800000;
    if (8 < uVar13) {
      uVar12 = uVar13;
    }
    uVar7 = 0x7e - ((int)local_c8.m_data[3] >> 0x17);
    uVar13 = (((uint)local_c8.m_data[3] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) +
             0x800000;
    if (8 < uVar7) {
      uVar13 = uVar7;
    }
    local_a8._4_4_ = (float)(uVar11 >> 0x18) / 255.0;
    local_a8._0_4_ = (float)(uVar1 >> 0x18) / 255.0;
    local_a8._12_4_ = (float)(uVar13 >> 0x18) / 255.0;
    local_a8._8_4_ = (float)(uVar12 >> 0x18) / 255.0;
    this = (tcu *)local_98;
    tcu::sRGBToLinear(this,(Vec4 *)local_a8);
    ptVar9 = (tcu *)&local_48;
    local_48 = 0;
    uStack_40 = 0;
    local_a8._0_4_ = R;
    local_a8._4_4_ = SNORM_INT8;
    local_a8._8_8_ = 0;
    lVar14 = 0;
    do {
      ptVar15 = this;
      if (local_ac[lVar14] == (tcu)0x0) {
        ptVar15 = ptVar9;
      }
      *(undefined4 *)(local_a8 + lVar14 * 4) = *(undefined4 *)ptVar15;
      lVar14 = lVar14 + 1;
      ptVar9 = ptVar9 + 4;
      this = this + 4;
    } while (lVar14 != 4);
    uVar20 = (ulong)local_a8._0_8_ >> 0x20;
    uVar18 = (ulong)local_a8._8_8_ >> 0x20;
    fVar21 = (float)local_a8._0_4_;
    fVar19 = (float)local_a8._8_4_;
  }
  else {
    TVar8 = tcu::getTextureChannelClass(texFormat->type);
    fVar4 = local_c8.m_data[3];
    fVar3 = local_c8.m_data[2];
    uVar2 = local_c8.m_data._0_8_;
    local_c8.m_data._0_8_ = GVar22.v._0_8_;
    local_c8.m_data._8_8_ = GVar22.v._8_8_;
    switch(TVar8) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      tcu::PixelBufferAccess::setPixel(&local_70,&local_c8,0,0,0);
      pCVar17 = (ConstPixelBufferAccess *)local_98;
      tcu::ConstPixelBufferAccess::getPixel(pCVar17,(int)&local_70,0,0);
      pCVar10 = (ConstPixelBufferAccess *)local_a8;
      local_c8.m_data._0_8_ = (undefined1 *)0x0;
      local_c8.m_data[2] = 0.0;
      local_c8.m_data[3] = 0.0;
      lVar14 = 0;
      do {
        pCVar16 = pCVar17;
        if (local_ac[lVar14] == (tcu)0x0) {
          pCVar16 = pCVar10;
        }
        local_c8.m_data[lVar14] = (float)(pCVar16->m_format).order;
        lVar14 = lVar14 + 1;
        pCVar10 = (ConstPixelBufferAccess *)&(pCVar10->m_format).type;
        pCVar17 = (ConstPixelBufferAccess *)&(pCVar17->m_format).type;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      tcu::PixelBufferAccess::setPixel(&local_70,(IVec4 *)&local_c8,0,0,0);
      pCVar17 = (ConstPixelBufferAccess *)local_98;
      tcu::ConstPixelBufferAccess::getPixelInt(pCVar17,(int)&local_70,0,0);
      pCVar10 = (ConstPixelBufferAccess *)local_a8;
      local_c8.m_data._0_8_ = (undefined1 *)0x0;
      local_c8.m_data[2] = 0.0;
      local_c8.m_data[3] = 0.0;
      lVar14 = 0;
      do {
        pCVar16 = pCVar10;
        if (local_ac[lVar14] != (tcu)0x0) {
          pCVar16 = pCVar17;
        }
        local_c8.m_data[lVar14] = (float)(pCVar16->m_format).order;
        lVar14 = lVar14 + 1;
        pCVar10 = (ConstPixelBufferAccess *)&(pCVar10->m_format).type;
        pCVar17 = (ConstPixelBufferAccess *)&(pCVar17->m_format).type;
      } while (lVar14 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      tcu::PixelBufferAccess::setPixel(&local_70,(IVec4 *)&local_c8,0,0,0);
      pCVar17 = (ConstPixelBufferAccess *)local_98;
      tcu::ConstPixelBufferAccess::getPixelInt(pCVar17,(int)&local_70,0,0);
      pCVar10 = (ConstPixelBufferAccess *)local_a8;
      local_c8.m_data._0_8_ = (undefined1 *)0x0;
      local_c8.m_data[2] = 0.0;
      local_c8.m_data[3] = 0.0;
      lVar14 = 0;
      do {
        pCVar16 = pCVar10;
        if (local_ac[lVar14] != (tcu)0x0) {
          pCVar16 = pCVar17;
        }
        local_c8.m_data[lVar14] = (float)(pCVar16->m_format).order;
        lVar14 = lVar14 + 1;
        pCVar10 = (ConstPixelBufferAccess *)&(pCVar10->m_format).type;
        pCVar17 = (ConstPixelBufferAccess *)&(pCVar17->m_format).type;
      } while (lVar14 != 4);
      break;
    default:
      uVar18 = 0;
      fVar19 = 0.0;
      uVar20 = 0;
      fVar21 = 0.0;
      local_c8.m_data._0_8_ = uVar2;
      local_c8.m_data[2] = fVar3;
      local_c8.m_data[3] = fVar4;
      goto LAB_01515190;
    }
    local_a8._8_8_ = 0;
    local_a8._0_4_ = R;
    local_a8._4_4_ = SNORM_INT8;
    uVar20 = (ulong)local_c8.m_data._0_8_ >> 0x20;
    uVar18 = (ulong)(uint)local_c8.m_data[3];
    fVar21 = local_c8.m_data[0];
    fVar19 = local_c8.m_data[2];
  }
LAB_01515190:
  de::detail::ArrayBuffer_AlignedFree(local_88.m_ptr);
  GVar22.v._0_8_ = (ulong)(uint)fVar21 | uVar20 << 0x20;
  GVar22.v._8_8_ = (ulong)(uint)fVar19 | uVar18 << 0x20;
  return (GenericVec4)GVar22.v;
}

Assistant:

rr::GenericVec4 mapToFormatColorRepresentable (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	// make sure value is representable in the target format and clear channels
	// not present in the target format.

	const rr::GenericVec4		inFormatUnits	= mapToFormatColorUnits(texFormat, normalizedRange);
	const tcu::BVec4			channelMask		= tcu::getTextureFormatChannelMask(texFormat);
	de::ArrayBuffer<deUint8, 4>	buffer			(texFormat.getPixelSize());
	tcu::PixelBufferAccess		access			(texFormat, tcu::IVec3(1, 1, 1), buffer.getPtr());

	if (tcu::isSRGB(texFormat))
	{
		DE_ASSERT(texFormat.type == tcu::TextureFormat::UNORM_INT8);

		// make sure border color (in linear space) can be converted to 8-bit sRGB space without
		// significant loss.
		const tcu::Vec4		sRGB		= tcu::linearToSRGB(normalizedRange);
		const tcu::IVec4	sRGB8		= tcu::IVec4(tcu::floatToU8(sRGB[0]),
													 tcu::floatToU8(sRGB[1]),
													 tcu::floatToU8(sRGB[2]),
													 tcu::floatToU8(sRGB[3]));
		const tcu::Vec4		linearized	= tcu::sRGBToLinear(tcu::Vec4((float)sRGB8[0] / 255.0f,
																	  (float)sRGB8[1] / 255.0f,
																	  (float)sRGB8[2] / 255.0f,
																	  (float)sRGB8[3] / 255.0f));

		return rr::GenericVec4(tcu::select(linearized, tcu::Vec4(0.0f), channelMask));
	}

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		{
			access.setPixel(inFormatUnits.get<float>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixel(0, 0), tcu::Vec4(0.0f), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deInt32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelInt(0, 0), tcu::IVec4(0), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deUint32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelUint(0, 0), tcu::UVec4(0u), channelMask));
		}
		default:
		{
			DE_ASSERT(false);
			return rr::GenericVec4();
		}
	}
}